

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_case21.c
# Opt level: O0

double cbspline(double u,int ider,hyb_gga_xc_case21_params *params)

{
  long in_RSI;
  int in_EDI;
  int i;
  double temp [5];
  double result;
  double *in_stack_00000270;
  double *in_stack_00000278;
  int in_stack_00000284;
  double in_stack_00000288;
  int in_stack_00000290;
  int in_stack_00000294;
  int local_4c;
  double local_48 [5];
  double local_20;
  long local_18;
  int local_c;
  
  local_20 = 0.0;
  local_18 = in_RSI;
  local_c = in_EDI;
  for (local_4c = 0; local_4c < *(int *)(local_18 + 4); local_4c = local_4c + 1) {
    xc_bspline(in_stack_00000294,in_stack_00000290,in_stack_00000288,in_stack_00000284,
               in_stack_00000278,in_stack_00000270);
    local_20 = *(double *)(local_18 + 200 + (long)local_4c * 8) * local_48[local_c] + local_20;
  }
  return local_20;
}

Assistant:

GPU_DEVICE_FUNCTION static double cbspline(double u, int ider, const hyb_gga_xc_case21_params * params) {
  assert(ider<=4);

  double result=0.0;
  double temp[5]; /* dimension ider+1 */
  for(int i=0;i<params->Nsp;i++) {
    xc_bspline(i, params->k, u, ider, params->knots, temp);
    result += params->cc[i]*temp[ider];
  }
  //printf("cbspline %i %e = % e\n",ider,u,result);
  return result;
}